

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptObject.cpp
# Opt level: O0

Var Js::JavascriptObject::EntryDefineProperties(RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  RecyclableObject *pRVar2;
  bool bVar3;
  int iVar4;
  CallFlags e;
  BOOL BVar5;
  TypeId TVar6;
  ScriptContext *pSVar7;
  ThreadContext *this;
  Var *values;
  undefined4 *puVar8;
  Var pvVar9;
  JavascriptLibrary *this_00;
  RecyclableObject *local_98;
  RecyclableObject *local_78;
  RecyclableObject *properties;
  Var propertiesVar;
  RecyclableObject *local_58;
  RecyclableObject *object;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar7 = RecyclableObject::GetScriptContext(function);
  this = ScriptContext::GetThreadContext(pSVar7);
  pSVar7 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(this,0xc00,pSVar7,(PVOID)0x0);
  iVar4 = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,iVar4);
  args.super_Arguments.Values = (Type)function_local;
  bVar3 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x555,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  object = (RecyclableObject *)RecyclableObject::GetScriptContext(function);
  e = Js::operator&((CallFlags)((ulong)function_local >> 0x18) &
                    (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|CallFlags_NotUsed
                     |CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|CallFlags_New),CallFlags_New
                   );
  bVar3 = operator!(e);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x55a,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  if (1 < ((uint)scriptContext & 0xffffff)) {
    pvVar9 = Arguments::operator[]((Arguments *)&scriptContext,1);
    BVar5 = Js::JavascriptOperators::IsObject(pvVar9);
    if (BVar5 != 0) {
      pvVar9 = Arguments::operator[]((Arguments *)&scriptContext,1);
      JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<void*>(pvVar9);
      pvVar9 = Arguments::operator[]((Arguments *)&scriptContext,1);
      local_58 = VarTo<Js::RecyclableObject>(pvVar9);
      TVar6 = RecyclableObject::GetTypeId(local_58);
      pRVar2 = local_58;
      if (TVar6 == TypeIds_HostDispatch) {
        Arguments::Arguments((Arguments *)&propertiesVar,(Arguments *)&scriptContext);
        iVar4 = (*(pRVar2->super_FinalizableObject).super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0x55])(pRVar2,EntryDefineProperties,&propertiesVar,0)
        ;
        if (iVar4 != 0) {
          return local_58;
        }
      }
      if (((uint)scriptContext & 0xffffff) < 3) {
        this_00 = RecyclableObject::GetLibrary(local_58);
        local_98 = JavascriptLibraryBase::GetUndefined(&this_00->super_JavascriptLibraryBase);
      }
      else {
        local_98 = (RecyclableObject *)Arguments::operator[]((Arguments *)&scriptContext,2);
      }
      properties = local_98;
      local_78 = (RecyclableObject *)0x0;
      BVar5 = JavascriptConversion::ToObject(local_98,(ScriptContext *)object,&local_78);
      if (BVar5 != 0) {
        pvVar9 = DefinePropertiesHelper(local_58,local_78,(ScriptContext *)object);
        return pvVar9;
      }
      JavascriptError::ThrowTypeError
                ((ScriptContext *)object,-0x7ff5ec32,L"Object.defineProperties");
    }
  }
  JavascriptError::ThrowTypeError((ScriptContext *)object,-0x7ff5ec36,L"Object.defineProperties");
}

Assistant:

Var JavascriptObject::EntryDefineProperties(RecyclableObject* function, CallInfo callInfo, ...)
{
    PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

    ARGUMENTS(args, callInfo);
    ScriptContext* scriptContext = function->GetScriptContext();

    CHAKRATEL_LANGSTATS_INC_BUILTINCOUNT(Object_Constructor_defineProperties);

    Assert(!(callInfo.Flags & CallFlags_New));

    if (args.Info.Count < 2 || !JavascriptOperators::IsObject(args[1]))
    {
        JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedObject, _u("Object.defineProperties"));
    }

#if ENABLE_COPYONACCESS_ARRAY
    JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(args[1]);
#endif
    RecyclableObject *object = VarTo<RecyclableObject>(args[1]);

    // If the object is HostDispatch try to invoke the operation remotely
    if (object->GetTypeId() == TypeIds_HostDispatch)
    {
        if (object->InvokeBuiltInOperationRemotely(EntryDefineProperties, args, NULL))
        {
            return object;
        }
    }

    Var propertiesVar = args.Info.Count > 2 ? args[2] : object->GetLibrary()->GetUndefined();
    RecyclableObject* properties = nullptr;
    if (FALSE == JavascriptConversion::ToObject(propertiesVar, scriptContext, &properties))
    {
        JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NullOrUndefined, _u("Object.defineProperties"));
    }

    return DefinePropertiesHelper(object, properties, scriptContext);
}